

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

int sat_solver2_solve(sat_solver2 *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,
                     ABC_INT64_T nInsLimit,ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  ABC_INT64_T *pAVar1;
  ABC_INT64_T *pAVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  uint *puVar6;
  int iVar7;
  uint *activity;
  int *piVar8;
  clause *pcVar9;
  sat_solver2 *begin_00;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint *puVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  char *pcVar19;
  timespec *__tp;
  int iVar20;
  sat_solver2 *psVar21;
  uint uVar22;
  ulong uVar23;
  char cVar24;
  int iVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  timespec ts;
  uint local_9c;
  ulong local_88;
  double local_70;
  timespec local_58;
  int *local_48;
  long local_40;
  sat_solver2 *local_38;
  
  s->hLearntLast = -1;
  s->hProofLast = -1;
  s->nConfLimit = 0;
  s->nInsLimit = 0;
  if (nConfLimit != 0) {
    s->nConfLimit = nConfLimit + (s->stats).conflicts;
  }
  if (nInsLimit != 0) {
    s->nInsLimit = nInsLimit + (s->stats).propagations;
  }
  pAVar1 = &s->nConfLimit;
  if ((nConfLimitGlobal != 0) && (*pAVar1 == 0 || nConfLimitGlobal < *pAVar1)) {
    *pAVar1 = nConfLimitGlobal;
  }
  if ((nInsLimitGlobal != 0) && (s->nInsLimit == 0 || nInsLimitGlobal < s->nInsLimit)) {
    s->nInsLimit = nInsLimitGlobal;
  }
  s->root_level = (int)((ulong)((long)end - (long)begin) >> 2);
  pcVar19 = (char *)pAVar1;
  psVar21 = s;
  if (begin < end) {
    do {
      uVar17 = *begin;
      iVar16 = (int)uVar17 >> 1;
      if (s->size <= iVar16) {
        __assert_fail("lit_var(p) < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x76a,
                      "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                     );
      }
      iVar11 = s->qtail;
      uVar10 = (s->trail_lim).cap;
      if ((s->trail_lim).size == uVar10) {
        iVar20 = (uVar10 >> 1) * 3;
        if ((int)uVar10 < 4) {
          iVar20 = uVar10 * 2;
        }
        piVar8 = (s->trail_lim).ptr;
        pcVar19 = (char *)((long)iVar20 << 2);
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc((size_t)pcVar19);
        }
        else {
          piVar8 = (int *)realloc(piVar8,(size_t)pcVar19);
        }
        (s->trail_lim).ptr = piVar8;
        if (piVar8 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->trail_lim).cap * 9.5367431640625e-07,0),
                 (double)iVar20 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->trail_lim).cap = iVar20;
      }
      iVar20 = (s->trail_lim).size;
      (s->trail_lim).size = iVar20 + 1;
      (s->trail_lim).ptr[iVar20] = iVar11;
      uVar10 = (uint)s->assigns[iVar16];
      if (uVar10 == 3) {
        s->assigns[iVar16] = (byte)uVar17 & 1;
        s->levels[iVar16] = (s->trail_lim).size;
        s->reasons[iVar16] = 0;
        iVar16 = s->qtail;
        s->qtail = iVar16 + 1;
        s->trail[iVar16] = uVar17;
      }
      else if ((uVar17 & 1) != uVar10) {
        uVar10 = s->reasons[iVar16];
        if (uVar10 == 0) {
          pcVar9 = (clause *)0x0;
        }
        else {
          uVar18 = (s->Mem).uPageMask & uVar10;
          if (uVar18 == 0) {
LAB_004f4805:
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                          ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          pcVar9 = (clause *)
                   ((s->Mem).pPages[(int)uVar10 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar18)
          ;
        }
        if (pcVar9 == (clause *)0x0) {
          if ((s->conf_final).size < 0) {
LAB_004f4843:
            __assert_fail("k <= v->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                          ,0x30,"void veci_resize(veci *, int)");
          }
          (s->conf_final).size = 0;
          if ((s->conf_final).cap == 0) {
            piVar8 = (s->conf_final).ptr;
            if (piVar8 == (int *)0x0) {
              piVar8 = (int *)malloc(0);
            }
            else {
              piVar8 = (int *)realloc(piVar8,0);
            }
            (s->conf_final).ptr = piVar8;
            if (piVar8 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->conf_final).cap * 9.5367431640625e-07,0),0);
              fflush(_stdout);
            }
            (s->conf_final).cap = 0;
          }
          piVar8 = (s->conf_final).ptr;
          iVar11 = (s->conf_final).size;
          (s->conf_final).size = iVar11 + 1;
          piVar8[iVar11] = uVar17 ^ 1;
          if (0 < s->levels[iVar16]) {
            uVar10 = (s->conf_final).cap;
            iVar16 = -1;
            if ((s->conf_final).size == uVar10) {
              iVar11 = (uVar10 >> 1) * 3;
              if ((int)uVar10 < 4) {
                iVar11 = uVar10 * 2;
              }
              if (piVar8 == (int *)0x0) {
                piVar8 = (int *)malloc((long)iVar11 << 2);
              }
              else {
                piVar8 = (int *)realloc(piVar8,(long)iVar11 << 2);
              }
              (s->conf_final).ptr = piVar8;
              if (piVar8 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       SUB84((double)(s->conf_final).cap * 9.5367431640625e-07,0),
                       (double)iVar11 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->conf_final).cap = iVar11;
            }
            goto LAB_004f4652;
          }
          iVar16 = -1;
        }
        else {
          iVar16 = solver2_analyze_final(s,pcVar9,1);
          uVar10 = (s->conf_final).cap;
          if ((s->conf_final).size == uVar10) {
            iVar11 = (uVar10 >> 1) * 3;
            if ((int)uVar10 < 4) {
              iVar11 = uVar10 * 2;
            }
            piVar8 = (s->conf_final).ptr;
            if (piVar8 == (int *)0x0) {
              piVar8 = (int *)malloc((long)iVar11 << 2);
            }
            else {
              piVar8 = (int *)realloc(piVar8,(long)iVar11 << 2);
            }
            (s->conf_final).ptr = piVar8;
            if (piVar8 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->conf_final).cap * 9.5367431640625e-07,0),
                     (double)iVar11 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->conf_final).cap = iVar11;
          }
          uVar17 = uVar17 ^ 1;
LAB_004f4652:
          piVar8 = &(s->conf_final).size;
          iVar11 = *piVar8;
          *piVar8 = iVar11 + 1;
          (s->conf_final).ptr[iVar11] = uVar17;
        }
        s->hProofLast = iVar16;
        goto LAB_004f466d;
      }
      psVar21 = s;
      pcVar9 = solver2_propagate(s);
      if (pcVar9 != (clause *)0x0) {
        iVar16 = solver2_analyze_final(s,pcVar9,0);
        if ((s->conf_final).size < 1) {
          __assert_fail("s->conf_final.size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x78b,
                        "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                       );
        }
        s->hProofLast = iVar16;
LAB_004f466d:
        solver2_canceluntil(s,0);
        return -1;
      }
      begin = (lit *)((uint *)begin + 1);
    } while (begin < end);
  }
  if (s->root_level != (s->trail_lim).size) {
    __assert_fail("s->root_level == solver2_dlevel(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x792,
                  "int sat_solver2_solve(sat_solver2 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                 );
  }
  if (0 < s->verbosity) {
    Abc_Print((int)psVar21,
              "==================================[MINISAT]===================================\n");
    Abc_Print((int)psVar21,
              "| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
    Abc_Print((int)psVar21,
              "|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
    pcVar19 = "==============================================================================\n";
    Abc_Print((int)psVar21,
              "==============================================================================\n");
  }
  local_48 = &s->root_level;
  uVar15 = 0;
  cVar24 = '\0';
LAB_004f3522:
  if (0 < s->verbosity) {
    uVar17 = (s->stats).learnts;
    dVar28 = (double)uVar17;
    dVar29 = (double)(s->stats).learnts_literals;
    dVar30 = 0.0;
    if (uVar17 != 0) {
      dVar30 = dVar29 / dVar28;
    }
    pcVar19 = "| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n";
    Abc_Print((int)psVar21,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
              SUB84((double)(s->stats).conflicts,0),(double)(s->stats).clauses,
              (double)(s->stats).clauses_literals,(double)s->nLearntMax,dVar28,dVar29,dVar30,
              s->progress_estimate * 100.0);
    fflush(_stdout);
  }
  if (s->nRuntimeLimit != 0) {
    iVar11 = 3;
    pcVar19 = (char *)&local_58;
    iVar16 = clock_gettime(3,(timespec *)pcVar19);
    if (iVar16 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    if (s->nRuntimeLimit < lVar14) {
LAB_004f44b1:
      if (0 < s->verbosity) {
        Abc_Print(iVar11,
                  "==============================================================================\n"
                 );
      }
      solver2_canceluntil(s,0);
      return (int)cVar24;
    }
  }
  if (((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) &&
     (s->pPrf2 == (Prf_Man_t *)0x0)) {
    sat_solver2_reducedb(s);
  }
  iVar16 = (int)uVar15;
  if (iVar16 == 0) {
    iVar11 = 0;
    iVar20 = 0;
  }
  else {
    iVar25 = 1;
    iVar20 = 0;
    do {
      iVar20 = iVar20 + 1;
      iVar11 = iVar25 * 2;
      iVar25 = iVar25 * 2 + 1;
    } while (iVar11 < iVar16);
  }
  if (iVar11 != iVar16) {
    do {
      iVar20 = iVar20 + -1;
      uVar15 = (long)(int)uVar15 % (long)(iVar11 >> 1);
      iVar11 = (iVar11 >> 1) + -1;
    } while (iVar11 != (int)uVar15);
  }
  dVar28 = ldexp(1.0,iVar20);
  if (s->root_level != (s->trail_lim).size) {
    __assert_fail("s->root_level == solver2_dlevel(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x3f2,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
  }
  (s->stats).starts = (s->stats).starts + 1;
  local_70 = 0.019999999552965164;
  if (s->fNotUseRandom != 0) {
    local_70 = 0.0;
  }
  uVar15 = (ulong)(iVar16 + 1);
  local_40 = (long)(dVar28 * 100.0);
  begin_00 = (sat_solver2 *)malloc(0x10);
  local_88 = 4;
  uVar17 = 0;
  lVar14 = 0;
  cVar24 = '\x04';
  __tp = (timespec *)pcVar19;
LAB_004f36f1:
  pcVar19 = (char *)solver2_propagate(s);
  if ((timespec *)pcVar19 == (timespec *)0x0) {
    if (lVar14 < local_40 || local_40 < 0) {
      if ((s->nRuntimeLimit != 0) && (((s->stats).conflicts & 0x3f) == 0)) {
        __tp = &local_58;
        iVar16 = clock_gettime(3,__tp);
        if (iVar16 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        if (s->nRuntimeLimit < lVar12) goto LAB_004f41b9;
      }
      if (((*pAVar1 != 0) && (*pAVar1 < (s->stats).conflicts)) ||
         ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_004f41b9;
      pAVar2 = &(s->stats).decisions;
      *pAVar2 = *pAVar2 + 1;
      puVar13 = (uint *)(s->order).ptr;
      dVar28 = s->random_seed * 1389796.0;
      piVar8 = s->orderpos;
      dVar28 = dVar28 - (double)(int)(dVar28 / 2147483647.0) * 2147483647.0;
      s->random_seed = dVar28;
      if (local_70 <= dVar28 / 2147483647.0) goto LAB_004f42d4;
      dVar28 = dVar28 * 1389796.0 -
               (double)(int)((dVar28 * 1389796.0) / 2147483647.0) * 2147483647.0;
      s->random_seed = dVar28;
      uVar10 = (uint)((double)s->size * (dVar28 / 2147483647.0));
      __tp = (timespec *)(ulong)uVar10;
      if (((int)uVar10 < 0) || (s->size <= (int)uVar10)) {
        __assert_fail("next >= 0 && next < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x10f,"int order_select(sat_solver2 *, float)");
      }
      bVar27 = s->assigns[uVar10] != '\x03';
      while (bVar27) {
LAB_004f42d4:
        iVar16 = (s->order).size;
        if ((long)iVar16 < 1) {
          uVar10 = 0xffffffff;
          break;
        }
        uVar10 = *puVar13;
        iVar11 = iVar16 + -1;
        uVar18 = puVar13[(long)iVar16 + -1];
        (s->order).size = iVar11;
        piVar8[(int)uVar10] = -1;
        if (iVar16 != 1) {
          iVar20 = 0;
          if (2 < iVar16) {
            puVar6 = s->activity;
            uVar22 = puVar6[(int)uVar18];
            iVar16 = 1;
            iVar20 = 0;
            do {
              iVar25 = iVar16 + 1;
              if ((iVar11 <= iVar25) ||
                 (puVar6[(int)puVar13[iVar25]] <= puVar6[(int)puVar13[iVar16]])) {
                iVar25 = iVar16;
              }
              uVar4 = puVar13[iVar25];
              if (puVar6[(int)uVar4] <= uVar22) break;
              puVar13[iVar20] = uVar4;
              piVar8[(int)uVar4] = iVar20;
              iVar16 = iVar25 * 2 + 1;
              iVar20 = iVar25;
            } while (iVar16 < iVar11);
          }
          puVar13[iVar20] = uVar18;
          piVar8[(int)uVar18] = iVar20;
        }
        bVar27 = s->assigns[(int)uVar10] != '\x03';
        __tp = (timespec *)((ulong)__tp & 0xffffffff);
        if (!bVar27) {
          __tp = (timespec *)(ulong)uVar10;
        }
        uVar10 = (uint)__tp;
      }
      if (uVar10 == 0xffffffff) {
        if (0 < s->size) {
          pcVar19 = s->assigns;
          lVar12 = 0;
          do {
            if (pcVar19[lVar12] == '\x03') {
              __assert_fail("var_value(s,i) != varX",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x440,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
            }
            s->model[lVar12] = -(uint)(pcVar19[lVar12] != '\0') | 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 < s->size);
        }
        pcVar19 = (char *)(ulong)(uint)s->root_level;
        psVar21 = s;
        solver2_canceluntil(s,s->root_level);
        cVar24 = '\x01';
        if (begin_00 != (sat_solver2 *)0x0) {
          psVar21 = begin_00;
          free(begin_00);
          begin_00 = (sat_solver2 *)0x0;
        }
        bVar27 = false;
      }
      else {
        uVar18 = uVar10 * 2;
        if (((uint)s->vi[(int)uVar10] & 1) == 0) {
          uVar18 = uVar18 | 1;
        }
        pcVar19 = (char *)(ulong)uVar18;
        psVar21 = s;
        solver2_assume(s,uVar18);
        bVar27 = true;
      }
    }
    else {
LAB_004f41b9:
      dVar28 = solver2_progress(s);
      s->progress_estimate = dVar28;
      pcVar19 = (char *)(ulong)(uint)s->root_level;
      psVar21 = s;
      solver2_canceluntil(s,s->root_level);
      if (begin_00 != (sat_solver2 *)0x0) {
        psVar21 = begin_00;
        free(begin_00);
        begin_00 = (sat_solver2 *)0x0;
      }
      bVar27 = false;
      cVar24 = '\0';
    }
    if (bVar27) goto LAB_004f41f8;
    bVar27 = false;
    goto LAB_004f4202;
  }
  pAVar2 = &(s->stats).conflicts;
  *pAVar2 = *pAVar2 + 1;
  iVar16 = s->root_level;
  iVar11 = (s->trail_lim).size;
  if (iVar11 <= iVar16) {
    psVar21 = s;
    iVar20 = solver2_analyze_final(s,(clause *)pcVar19,0);
    if (iVar20 < 1 && s->pPrf1 != (Vec_Set_t *)0x0) {
      __assert_fail("proof_id > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x406,"lbool solver2_search(sat_solver2 *, ABC_INT64_T)");
    }
    s->hProofLast = iVar20;
    cVar24 = -1;
    if (begin_00 != (sat_solver2 *)0x0) {
      psVar21 = begin_00;
      free(begin_00);
      begin_00 = (sat_solver2 *)0x0;
    }
    goto LAB_004f4130;
  }
  if (-1 < (int)uVar17) {
    if ((s->tagged).size != 0) {
      __assert_fail("veci_size(&s->tagged) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x313,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
    }
    iVar20 = s->qtail;
    proof_chain_start(s,(clause *)pcVar19);
    if ((int)local_88 == 0) {
      if (begin_00 == (sat_solver2 *)0x0) {
        begin_00 = (sat_solver2 *)malloc(0);
      }
      else {
        begin_00 = (sat_solver2 *)realloc(begin_00,0);
      }
      local_88 = 0;
      if (begin_00 == (sat_solver2 *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",0,0);
        fflush(_stdout);
      }
    }
    iVar20 = iVar20 + -1;
    begin_00->size = -2;
    iVar25 = 0;
    local_9c = 1;
    uVar17 = 0;
    do {
      uVar10 = (uint)((timespec *)pcVar19)->tv_sec;
      if ((uVar10 & 1) != 0) {
        iVar7 = *(int *)((long)&((timespec *)pcVar19)->tv_sec + (ulong)(uVar10 >> 0xb) * 4 + 4);
        if (((long)iVar7 < 0) || ((s->act_clas).size <= iVar7)) {
          __assert_fail("Id >= 0 && Id < veci_size(&s->act_clas)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x17e,"void act_clause2_bump(sat_solver2 *, clause *)");
        }
        piVar5 = (s->act_clas).ptr;
        piVar8 = piVar5 + iVar7;
        *piVar8 = *piVar8 + s->cla_inc;
        if (*piVar8 < 0) {
          if (0 < (s->act_clas).size) {
            lVar12 = 0;
            do {
              puVar13 = (uint *)(piVar5 + lVar12);
              *puVar13 = *puVar13 >> 0xe;
              lVar12 = lVar12 + 1;
            } while (lVar12 < (s->act_clas).size);
          }
          iVar7 = s->cla_inc >> 0xe;
          if (iVar7 < 0x401) {
            iVar7 = 0x400;
          }
          s->cla_inc = iVar7;
        }
      }
      if ((uint)(0 < (int)uVar17) < (uint)((timespec *)pcVar19)->tv_sec >> 0xb) {
        uVar26 = (ulong)(0 < (int)uVar17);
        do {
          uVar17 = *(uint *)((long)&((timespec *)pcVar19)->tv_sec + uVar26 * 4 + 4);
          if (uVar17 < 2) break;
          uVar17 = (int)uVar17 >> 1;
          if (((int)uVar17 < 0) || (s->size <= (int)uVar17)) {
            __assert_fail("x >= 0 && x < s->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,799,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
          }
          if (((uint)s->vi[uVar17] & 0x3c) == 0) {
            if (s->levels[uVar17] == 0) {
              proof_chain_resolve(s,(clause *)0x0,uVar17);
            }
            else {
              uVar10 = (s->tagged).cap;
              if ((s->tagged).size == uVar10) {
                iVar7 = (uVar10 >> 1) * 3;
                if ((int)uVar10 < 4) {
                  iVar7 = uVar10 * 2;
                }
                piVar8 = (s->tagged).ptr;
                local_38 = begin_00;
                if (piVar8 == (int *)0x0) {
                  piVar8 = (int *)malloc((long)iVar7 << 2);
                }
                else {
                  piVar8 = (int *)realloc(piVar8,(long)iVar7 << 2);
                }
                (s->tagged).ptr = piVar8;
                if (piVar8 == (int *)0x0) {
                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                         SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                         (double)iVar7 * 9.5367431640625e-07);
                  fflush(_stdout);
                }
                (s->tagged).cap = iVar7;
                begin_00 = local_38;
              }
              iVar7 = (s->tagged).size;
              (s->tagged).size = iVar7 + 1;
              (s->tagged).ptr[iVar7] = uVar17;
              *(byte *)(s->vi + uVar17) = *(byte *)(s->vi + uVar17) & 0xc3 | 4;
              puVar6 = s->activity;
              puVar13 = puVar6 + uVar17;
              *puVar13 = *puVar13 + s->var_inc;
              if ((int)*puVar13 < 0) {
                if (0 < s->size) {
                  lVar12 = 0;
                  do {
                    puVar6[lVar12] = puVar6[lVar12] >> 0x13;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 < s->size);
                }
                iVar7 = s->var_inc >> 0x13;
                if (iVar7 < 0x11) {
                  iVar7 = 0x10;
                }
                s->var_inc = iVar7;
              }
              piVar8 = s->orderpos;
              uVar10 = piVar8[uVar17];
              uVar23 = (ulong)(int)uVar10;
              if (uVar23 != 0xffffffffffffffff) {
                piVar5 = (s->order).ptr;
                iVar7 = piVar5[uVar23];
                if (uVar10 != 0) {
                  do {
                    uVar18 = (uint)uVar23;
                    uVar22 = (int)((uVar18 - ((int)(uVar18 - 1) >> 0x1f)) + -1) >> 1;
                    iVar3 = piVar5[(int)uVar22];
                    uVar10 = uVar18;
                    if (puVar6[iVar7] <= puVar6[iVar3]) break;
                    piVar5[(int)uVar18] = iVar3;
                    piVar8[iVar3] = uVar18;
                    uVar23 = (ulong)uVar22;
                    uVar10 = uVar22;
                  } while (2 < uVar18);
                }
                piVar5[(int)uVar10] = iVar7;
                piVar8[iVar7] = uVar10;
              }
              if (s->levels[uVar17] == (s->trail_lim).size) {
                iVar25 = iVar25 + 1;
              }
              else {
                iVar7 = *(int *)((long)&((timespec *)pcVar19)->tv_sec + uVar26 * 4 + 4);
                uVar17 = (uint)local_88;
                if (local_9c == uVar17) {
                  uVar10 = (int)(local_88 >> 1) * 3;
                  if ((int)uVar17 < 4) {
                    uVar10 = uVar17 * 2;
                  }
                  local_88 = (ulong)uVar10;
                  if (begin_00 == (sat_solver2 *)0x0) {
                    begin_00 = (sat_solver2 *)malloc((long)(int)uVar10 << 2);
                  }
                  else {
                    begin_00 = (sat_solver2 *)realloc(begin_00,(long)(int)uVar10 << 2);
                  }
                  if (begin_00 == (sat_solver2 *)0x0) {
                    printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                           SUB84((double)(int)uVar17 * 9.5367431640625e-07,0),
                           (double)(int)uVar10 * 9.5367431640625e-07);
                    fflush(_stdout);
                  }
                }
                lVar12 = (long)(int)local_9c;
                local_9c = local_9c + 1;
                (begin_00->Mem).nEntries[lVar12 + -0x1e] = iVar7;
              }
            }
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < (uint)((timespec *)pcVar19)->tv_sec >> 0xb);
      }
      puVar13 = (uint *)(s->trail + iVar20);
      do {
        uVar17 = *puVar13;
        iVar7 = (int)uVar17 >> 1;
        puVar13 = puVar13 + -1;
        iVar20 = iVar20 + -1;
      } while (((uint)s->vi[iVar7] & 0x3c) == 0);
      uVar10 = s->reasons[iVar7];
      if (uVar10 == 0) {
        pcVar19 = (char *)0x0;
      }
      else {
        uVar18 = (s->Mem).uPageMask & uVar10;
        if (uVar18 == 0) goto LAB_004f4805;
        pcVar19 = (char *)((s->Mem).pPages[(int)uVar10 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                          (int)uVar18);
      }
      iVar25 = iVar25 + -1;
      if (iVar25 == 0) goto LAB_004f3c4a;
      proof_chain_resolve(s,(clause *)pcVar19,iVar7);
      if ((timespec *)pcVar19 == (timespec *)0x0) {
        __assert_fail("c != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x31b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
      }
    } while( true );
  }
  goto LAB_004f4843;
LAB_004f3c4a:
  begin_00->size = uVar17 ^ 1;
  if ((s->mark_levels).size != 0) {
    __assert_fail("veci_size(&s->mark_levels) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x33b,"int solver2_analyze(sat_solver2 *, clause *, veci *)");
  }
  if (1 < (int)local_9c) {
    uVar26 = 1;
    do {
      iVar20 = s->levels[(begin_00->Mem).nEntries[uVar26 - 0x1e] >> 1];
      if ((s->trail_lim).size <= iVar20) {
        __assert_fail("level < veci_size(&s->trail_lim)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x83,"void var_lev_set_mark(sat_solver2 *, int)");
      }
      puVar13 = (uint *)((s->trail_lim).ptr + iVar20);
      *puVar13 = *puVar13 | 0x80000000;
      uVar17 = (s->mark_levels).cap;
      if ((s->mark_levels).size == uVar17) {
        iVar25 = (uVar17 >> 1) * 3;
        if ((int)uVar17 < 4) {
          iVar25 = uVar17 * 2;
        }
        piVar8 = (s->mark_levels).ptr;
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc((long)iVar25 << 2);
        }
        else {
          piVar8 = (int *)realloc(piVar8,(long)iVar25 << 2);
        }
        (s->mark_levels).ptr = piVar8;
        if (piVar8 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->mark_levels).cap * 9.5367431640625e-07,0),
                 (double)iVar25 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->mark_levels).cap = iVar25;
      }
      iVar25 = (s->mark_levels).size;
      (s->mark_levels).size = iVar25 + 1;
      (s->mark_levels).ptr[iVar25] = iVar20;
      uVar26 = uVar26 + 1;
    } while (local_9c != uVar26);
  }
  if ((s->min_lit_order).size < 0) goto LAB_004f4843;
  (s->min_lit_order).size = 0;
  uVar17 = 1;
  if (1 < (int)local_9c) {
    uVar17 = 1;
    uVar26 = 1;
    do {
      iVar20 = solver2_lit_removable_rec(s,(begin_00->Mem).nEntries[uVar26 - 0x1e] >> 1);
      if (iVar20 == 0) {
        lVar12 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        (begin_00->Mem).nEntries[lVar12 + -0x1e] = (begin_00->Mem).nEntries[uVar26 - 0x1e];
      }
      uVar26 = uVar26 + 1;
    } while (local_9c != uVar26);
  }
  if (s->fProofLogging == 0) {
    iVar20 = 0;
  }
  else {
    if ((s->min_step_order).size < 0) goto LAB_004f4843;
    (s->min_step_order).size = 0;
    if (0 < (s->min_lit_order).size) {
      piVar8 = (s->min_lit_order).ptr;
      lVar12 = 0;
      do {
        solver2_logging_order_rec(s,piVar8[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (s->min_lit_order).size);
    }
    lVar12 = (long)(s->min_step_order).size;
    if (0 < lVar12) {
      piVar8 = (s->min_step_order).ptr;
      do {
        iVar20 = piVar8[lVar12 + -1];
        uVar10 = s->reasons[iVar20];
        if (uVar10 == 0) {
          pcVar9 = (clause *)0x0;
        }
        else {
          uVar18 = (s->Mem).uPageMask & uVar10;
          if (uVar18 == 0) goto LAB_004f4805;
          pcVar9 = (clause *)
                   ((s->Mem).pPages[(int)uVar10 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar18)
          ;
        }
        proof_chain_resolve(s,pcVar9,iVar20);
        if (0xfff < (uint)*pcVar9) {
          uVar26 = 1;
          do {
            if ((uint)pcVar9[uVar26 + 1] < 2) break;
            iVar20 = (int)pcVar9[uVar26 + 1] >> 1;
            if (s->levels[iVar20] == 0) {
              proof_chain_resolve(s,(clause *)0x0,iVar20);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 < (uint)*pcVar9 >> 0xb);
        }
        bVar27 = 1 < lVar12;
        lVar12 = lVar12 + -1;
      } while (bVar27);
    }
    iVar20 = proof_chain_stop(s);
  }
  iVar25 = (s->mark_levels).size;
  if (0 < iVar25) {
    piVar8 = (s->mark_levels).ptr;
    piVar5 = (s->trail_lim).ptr;
    lVar12 = 0;
    do {
      puVar13 = (uint *)(piVar5 + piVar8[lVar12]);
      *puVar13 = *puVar13 & 0x7fffffff;
      lVar12 = lVar12 + 1;
      iVar25 = (s->mark_levels).size;
    } while (lVar12 < iVar25);
  }
  if ((iVar25 < 0) || ((s->mark_levels).size = 0, (int)local_9c < (int)uVar17)) goto LAB_004f4843;
  pAVar2 = &(s->stats).tot_literals;
  *pAVar2 = *pAVar2 + (long)(int)uVar17;
  iVar25 = (s->tagged).size;
  if (0 < iVar25) {
    piVar8 = (s->tagged).ptr;
    lVar12 = 0;
    do {
      *(byte *)(s->vi + piVar8[lVar12]) = *(byte *)(s->vi + piVar8[lVar12]) & 0xc3;
      lVar12 = lVar12 + 1;
      iVar25 = (s->tagged).size;
    } while (lVar12 < iVar25);
  }
  if (iVar25 < 0) goto LAB_004f4843;
  (s->tagged).size = 0;
  piVar8 = local_48;
  if (1 < (int)uVar17) {
    iVar25 = begin_00->cap;
    piVar8 = s->levels;
    lVar12 = 1;
    if (uVar17 != 2) {
      iVar7 = piVar8[iVar25 >> 1];
      uVar23 = 1;
      uVar26 = 2;
      do {
        iVar3 = piVar8[(begin_00->Mem).nEntries[uVar26 - 0x1e] >> 1];
        if (iVar7 < iVar3) {
          uVar23 = uVar26 & 0xffffffff;
        }
        if (iVar7 <= iVar3) {
          iVar7 = iVar3;
        }
        uVar26 = uVar26 + 1;
      } while (uVar17 != uVar26);
      lVar12 = (long)(int)uVar23;
    }
    begin_00->cap = (begin_00->Mem).nEntries[lVar12 + -0x1e];
    (begin_00->Mem).nEntries[lVar12 + -0x1e] = iVar25;
    piVar8 = piVar8 + (begin_00->cap >> 1);
  }
  iVar25 = *piVar8;
  if (*piVar8 < s->root_level) {
    iVar25 = s->root_level;
  }
  solver2_canceluntil(s,iVar25);
  psVar21 = s;
  iVar20 = clause2_create_new(s,&begin_00->size,(begin_00->Mem).nEntries + (long)(int)uVar17 + -0x1e
                              ,1,iVar20);
  if ((int)uVar17 < 1) {
    __assert_fail("veci_size(cls) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x221,"void solver2_record(sat_solver2 *, veci *, int)");
  }
  iVar25 = iVar20;
  if (uVar17 == 1) {
    iVar25 = 0;
    if (s->fProofLogging != 0) {
      uVar10 = begin_00->size >> 1;
      if ((-1 < (int)uVar10) && ((int)uVar10 < s->size)) {
        if (s->units[uVar10] == 0) {
          s->units[uVar10] = iVar20;
          s->nUnits = s->nUnits + 1;
          iVar25 = 0;
          goto LAB_004f40a2;
        }
      }
      __assert_fail("v >= 0 && v < s->size && !s->units[v]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x99,"void var_set_unit_clause(sat_solver2 *, int, cla)");
    }
  }
LAB_004f40a2:
  iVar20 = begin_00->size;
  pcVar19 = s->assigns;
  lVar12 = (long)(iVar20 >> 1);
  if (*(char *)((long)&((timespec *)pcVar19)->tv_sec + lVar12) == '\x03') {
    *(byte *)((long)&((timespec *)pcVar19)->tv_sec + lVar12) = (byte)iVar20 & 1;
    psVar21 = (sat_solver2 *)s->levels;
    (psVar21->Mem).nEntries[lVar12 + -0x1e] = (s->trail_lim).size;
    s->reasons[lVar12] = iVar25;
    iVar25 = s->qtail;
    uVar10 = iVar25 + 1;
    pcVar19 = (char *)(ulong)uVar10;
    s->qtail = uVar10;
    s->trail[iVar25] = iVar20;
  }
  if (uVar17 == 1) {
    s->levels[begin_00->size >> 1] = 0;
  }
  s->var_inc = (s->var_inc >> 4) + s->var_inc;
  s->cla_inc = (s->cla_inc >> 10) + s->cla_inc;
LAB_004f4130:
  lVar14 = lVar14 + 1;
  if (iVar16 < iVar11) {
LAB_004f41f8:
    bVar27 = true;
  }
  else {
    bVar27 = false;
  }
LAB_004f4202:
  iVar11 = (int)psVar21;
  __tp = (timespec *)pcVar19;
  if (!bVar27) goto LAB_004f4430;
  goto LAB_004f36f1;
LAB_004f4430:
  if ((((*pAVar1 != 0) && (*pAVar1 < (s->stats).conflicts)) ||
      ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) || (cVar24 != '\0'))
  goto LAB_004f44b1;
  goto LAB_004f3522;
}

Assistant:

int sat_solver2_solve(sat_solver2* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    int restart_iter = 0;
    ABC_INT64_T  nof_conflicts;
    lbool status = l_Undef;
    int proof_id;
    lit * i;

    s->hLearntLast = -1;
    s->hProofLast = -1;

    // set the external limits
//    s->nCalls++;
//    s->nRestarts  = 0;
    s->nConfLimit = 0;
    s->nInsLimit  = 0;
    if ( nConfLimit )
        s->nConfLimit = s->stats.conflicts + nConfLimit;
    if ( nInsLimit )
//        s->nInsLimit = s->stats.inspects + nInsLimit;
        s->nInsLimit = s->stats.propagations + nInsLimit;
    if ( nConfLimitGlobal && (s->nConfLimit == 0 || s->nConfLimit > nConfLimitGlobal) )
        s->nConfLimit = nConfLimitGlobal;
    if ( nInsLimitGlobal && (s->nInsLimit == 0 || s->nInsLimit > nInsLimitGlobal) )
        s->nInsLimit = nInsLimitGlobal;

/*
    // Perform assumptions:
    root_level = assumps.size();
    for (int i = 0; i < assumps.size(); i++){
        Lit p = assumps[i];
        assert(var(p) < nVars());
        if (!solver2_assume(p)){
            GClause r = reason[var(p)];
            if (r != Gclause2_NULL){
                clause* confl;
                if (r.isLit()){
                    confl = propagate_tmpbin;
                    (*confl)[1] = ~p;
                    (*confl)[0] = r.lit();
                }else
                    confl = r.clause();
                analyzeFinal(confl, true);
                conflict.push(~p);
            }else
                conflict.clear(),
                conflict.push(~p);
            cancelUntil(0);
            return false; }
        clause* confl = propagate();
        if (confl != NULL){
            analyzeFinal(confl), assert(conflict.size() > 0);
            cancelUntil(0);
            return false; }
    }
    assert(root_level == decisionLevel());
*/

    // Perform assumptions:
    s->root_level = end - begin;
    for ( i = begin; i < end; i++ )
    {
        lit p = *i;
        assert(lit_var(p) < s->size);
        veci_push(&s->trail_lim,s->qtail);
        if (!solver2_enqueue(s,p,0))
        {
            clause* r = clause2_read(s, lit_reason(s,p));
            if (r != NULL)
            {
                clause* confl = r;
                proof_id = solver2_analyze_final(s, confl, 1);
                veci_push(&s->conf_final, lit_neg(p));
            }
            else
            {
//                assert( 0 );
//                r = var_unit_clause( s, lit_var(p) );
//                assert( r != NULL );
//                proof_id = clause2_proofid(s, r, 0);
                proof_id = -1; // the only case when ProofId is not assigned (conflicting assumptions)
                veci_resize(&s->conf_final,0);
                veci_push(&s->conf_final, lit_neg(p));
                // the two lines below are a bug fix by Siert Wieringa 
                if (var_level(s, lit_var(p)) > 0)
                    veci_push(&s->conf_final, p);
            }
            s->hProofLast = proof_id;
            solver2_canceluntil(s, 0);
            return l_False;
        }
        else
        {
            clause* confl = solver2_propagate(s);
            if (confl != NULL){
                proof_id = solver2_analyze_final(s, confl, 0);
                assert(s->conf_final.size > 0);
                s->hProofLast = proof_id;
                solver2_canceluntil(s, 0);
                return l_False;
            }
        }
    }
    assert(s->root_level == solver2_dlevel(s));

    if (s->verbosity >= 1){
        Abc_Print(1,"==================================[MINISAT]===================================\n");
        Abc_Print(1,"| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        Abc_Print(1,"|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        Abc_Print(1,"==============================================================================\n");
    }

    while (status == l_Undef){
        if (s->verbosity >= 1)
        {
            Abc_Print(1,"| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
                (double)s->stats.conflicts,
                (double)s->stats.clauses,
                (double)s->stats.clauses_literals,
                (double)s->nLearntMax,
                (double)s->stats.learnts,
                (double)s->stats.learnts_literals,
                (s->stats.learnts == 0)? 0.0 : (double)s->stats.learnts_literals / s->stats.learnts,
                s->progress_estimate*100);
            fflush(stdout);
        }
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        // reduce the set of learnt clauses
        if ( s->nLearntMax && veci_size(&s->act_clas) >= s->nLearntMax && s->pPrf2 == NULL )
            sat_solver2_reducedb(s);
        // perform next run
        nof_conflicts = (ABC_INT64_T)( 100 * luby2(2, restart_iter++) );
        status = solver2_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
    }
    if (s->verbosity >= 1)
        Abc_Print(1,"==============================================================================\n");

    solver2_canceluntil(s,0);
//    assert( s->qhead == s->qtail );
//    if ( status == l_True )
//        sat_solver2_verify( s );
    return status;
}